

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O2

Vec_Int_t * Abc_NtkCollectCiSupps(Abc_Ntk_t *pNtk,int fVerbose)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  abctime aVar6;
  Vec_Ptr_t *p;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Wec_t *p_02;
  Abc_Obj_t *pAVar7;
  Vec_Int_t *pVVar8;
  Vec_Int_t *pVVar9;
  void *pvVar10;
  abctime aVar11;
  abctime time;
  int iVar12;
  long lVar13;
  Vec_Int_t t;
  
  aVar6 = Abc_Clock();
  p = Abc_NtkDfs(pNtk,0);
  p_00 = Vec_IntAlloc(0);
  p_01 = Vec_IntAlloc(pNtk->vCis->nSize);
  p_02 = Vec_WecStart(pNtk->vObjs->nSize);
  for (iVar12 = 0; iVar12 < pNtk->vCos->nSize; iVar12 = iVar12 + 1) {
    pAVar7 = Abc_NtkCo(pNtk,iVar12);
    pVVar8 = Vec_WecEntry(p_02,pAVar7->Id);
    pVVar9 = Vec_WecEntry(p_02,*(pAVar7->vFanins).pArray);
    Vec_IntPush(pVVar8,iVar12);
    Vec_IntTwoMerge2(pVVar9,pVVar8,p_00);
    iVar4 = pVVar9->nCap;
    iVar5 = pVVar9->nSize;
    piVar1 = pVVar9->pArray;
    iVar3 = p_00->nSize;
    piVar2 = p_00->pArray;
    pVVar9->nCap = p_00->nCap;
    pVVar9->nSize = iVar3;
    pVVar9->pArray = piVar2;
    p_00->nCap = iVar4;
    p_00->nSize = iVar5;
    p_00->pArray = piVar1;
  }
  iVar12 = p->nSize;
  while (0 < iVar12) {
    iVar12 = iVar12 + -1;
    pvVar10 = Vec_PtrEntry(p,iVar12);
    pVVar8 = Vec_WecEntry(p_02,*(int *)((long)pvVar10 + 0x10));
    for (lVar13 = 0; lVar13 < *(int *)((long)pvVar10 + 0x1c); lVar13 = lVar13 + 1) {
      pVVar9 = Vec_WecEntry(p_02,*(int *)(*(long *)((long)pvVar10 + 0x20) + lVar13 * 4));
      Vec_IntTwoMerge2(pVVar9,pVVar8,p_00);
      iVar4 = pVVar9->nCap;
      iVar5 = pVVar9->nSize;
      piVar1 = pVVar9->pArray;
      iVar3 = p_00->nSize;
      piVar2 = p_00->pArray;
      pVVar9->nCap = p_00->nCap;
      pVVar9->nSize = iVar3;
      pVVar9->pArray = piVar2;
      p_00->nCap = iVar4;
      p_00->nSize = iVar5;
      p_00->pArray = piVar1;
    }
  }
  for (iVar12 = 0; iVar12 < pNtk->vCis->nSize; iVar12 = iVar12 + 1) {
    pAVar7 = Abc_NtkCi(pNtk,iVar12);
    pVVar8 = Vec_WecEntry(p_02,pAVar7->Id);
    Vec_IntPush(p_01,pVVar8->nSize);
  }
  Vec_WecFree(p_02);
  Vec_PtrFree(p);
  Vec_IntFree(p_00);
  if (fVerbose != 0) {
    aVar11 = Abc_Clock();
    Abc_PrintTime(0x7a8c98,(char *)(aVar11 - aVar6),time);
  }
  return p_01;
}

Assistant:

Vec_Int_t * Abc_NtkCollectCiSupps( Abc_Ntk_t * pNtk, int fVerbose )
{
    abctime clk = Abc_Clock();
    Abc_Obj_t * pNode; int i, k;
    Vec_Ptr_t * vNodes = Abc_NtkDfs( pNtk, 0 );
    Vec_Int_t * vFanin, * vFanout, * vTemp = Vec_IntAlloc( 0 );
    Vec_Int_t * vSuppsCi = Vec_IntAlloc( Abc_NtkCiNum(pNtk) );
    Vec_Wec_t * vSupps = Vec_WecStart( Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        vFanout = Vec_WecEntry(vSupps, Abc_ObjId(pNode));
        vFanin = Vec_WecEntry(vSupps, Abc_ObjFaninId0(pNode));
        Vec_IntPush( vFanout, i );
        Vec_IntTwoMerge2( vFanin, vFanout, vTemp );
        ABC_SWAP( Vec_Int_t, *vFanin, *vTemp );
    }
    Vec_PtrForEachEntryReverse( Abc_Obj_t *, vNodes, pNode, i )
    {
        vFanout = Vec_WecEntry(vSupps, Abc_ObjId(pNode));
        for ( k = 0; k < Abc_ObjFaninNum(pNode); k++ )
        {
            vFanin = Vec_WecEntry(vSupps, Abc_ObjFaninId(pNode, k));
            Vec_IntTwoMerge2( vFanin, vFanout, vTemp );
            ABC_SWAP( Vec_Int_t, *vFanin, *vTemp );
        }
    }
    Abc_NtkForEachCi( pNtk, pNode, i )
        Vec_IntPush( vSuppsCi, Vec_IntSize(Vec_WecEntry(vSupps, Abc_ObjId(pNode))) );
    Vec_WecFree( vSupps );
    Vec_PtrFree( vNodes );
    Vec_IntFree( vTemp );
    if ( fVerbose )
        Abc_PrintTime( 1, "Output support computation", Abc_Clock() - clk );
    //Vec_IntPrint( vSuppsCi );
    return vSuppsCi;
}